

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpacceptor.cpp
# Opt level: O2

void __thiscall TCPAcceptor::~TCPAcceptor(TCPAcceptor *this)

{
  if (0 < this->m_lsd) {
    close(this->m_lsd);
  }
  std::__cxx11::string::~string((string *)&this->m_address);
  return;
}

Assistant:

TCPAcceptor::~TCPAcceptor()
{
    if (m_lsd > 0) {
        close(m_lsd);
    }
}